

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

int Emb_ManComputeDistance_old(Emb_Man_t *p,Emb_Obj_t *pPivot)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint hHandle;
  bool bVar3;
  int local_4c;
  int nVisited;
  int d;
  int k;
  int i;
  Emb_Obj_t *pNext;
  Emb_Obj_t *pThis;
  Vec_Int_t *vTemp;
  Vec_Int_t *vNext;
  Vec_Int_t *vThis;
  Emb_Obj_t *pPivot_local;
  Emb_Man_t *p_local;
  
  vNext = Vec_IntAlloc(1000);
  vTemp = Vec_IntAlloc(1000);
  Emb_ManIncrementTravId(p);
  Emb_ObjSetTravIdCurrent(p,pPivot);
  Vec_IntPush(vNext,pPivot->hHandle);
  local_4c = 0;
  while (pVVar1 = vNext, iVar2 = Vec_IntSize(vNext), 0 < iVar2) {
    Vec_IntSize(vNext);
    Vec_IntClear(vTemp);
    d = 0;
    while( true ) {
      iVar2 = Vec_IntSize(vNext);
      bVar3 = false;
      if (d < iVar2) {
        hHandle = Vec_IntEntry(vNext,d);
        pNext = Emb_ManObj(p,hHandle);
        bVar3 = pNext != (Emb_Obj_t *)0x0;
      }
      if (!bVar3) break;
      nVisited = 0;
      while( true ) {
        bVar3 = false;
        if (nVisited < (int)(*(uint *)pNext >> 4)) {
          _k = Emb_ObjFanin(pNext,nVisited);
          bVar3 = _k != (Emb_Obj_t *)0x0;
        }
        if (!bVar3) break;
        iVar2 = Emb_ObjIsTravIdCurrent(p,_k);
        if (iVar2 == 0) {
          Emb_ObjSetTravIdCurrent(p,_k);
          Vec_IntPush(vTemp,_k->hHandle);
          Emb_ObjIsTerm(_k);
        }
        nVisited = nVisited + 1;
      }
      nVisited = 0;
      while( true ) {
        bVar3 = false;
        if (nVisited < (int)pNext->nFanouts) {
          _k = Emb_ObjFanout(pNext,nVisited);
          bVar3 = _k != (Emb_Obj_t *)0x0;
        }
        if (!bVar3) break;
        iVar2 = Emb_ObjIsTravIdCurrent(p,_k);
        if (iVar2 == 0) {
          Emb_ObjSetTravIdCurrent(p,_k);
          Vec_IntPush(vTemp,_k->hHandle);
          Emb_ObjIsTerm(_k);
        }
        nVisited = nVisited + 1;
      }
      d = d + 1;
    }
    vNext = vTemp;
    vTemp = pVVar1;
    local_4c = local_4c + 1;
  }
  Vec_IntFree(vNext);
  Vec_IntFree(vTemp);
  return local_4c;
}

Assistant:

int Emb_ManComputeDistance_old( Emb_Man_t * p, Emb_Obj_t * pPivot )
{
    Vec_Int_t * vThis, * vNext, * vTemp;
    Emb_Obj_t * pThis, * pNext;
    int i, k, d, nVisited = 0;
//    assert( Emb_ObjIsTerm(pPivot) );
    vThis = Vec_IntAlloc( 1000 );
    vNext = Vec_IntAlloc( 1000 );
    Emb_ManIncrementTravId( p );
    Emb_ObjSetTravIdCurrent( p, pPivot );
    Vec_IntPush( vThis, pPivot->hHandle );
    for ( d = 0; Vec_IntSize(vThis) > 0; d++ )
    {
        nVisited += Vec_IntSize(vThis);
        Vec_IntClear( vNext );
        Emb_ManForEachObjVec( vThis, p, pThis, i )
        {
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
                nVisited += !Emb_ObjIsTerm(pNext);
            }
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
                nVisited += !Emb_ObjIsTerm(pNext);
            }
        }
        vTemp = vThis; vThis = vNext; vNext = vTemp;
    }
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    // check if there are several strongly connected components
//    if ( nVisited < Emb_ManNodeNum(p) )
//        printf( "Visited less nodes (%d) than present (%d).\n", nVisited, Emb_ManNodeNum(p) );
    return d;
}